

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_buffer.c
# Opt level: O1

int main(void)

{
  int iVar1;
  
  UnityBegin(
            "/workspace/llm4binary/github/license_c_cmakelists/gatzka[P]cio/tests/test_read_buffer.c"
            );
  UnityDefaultTestRun(test_init_read_buffer,"test_init_read_buffer",0x55);
  UnityDefaultTestRun(test_init_no_read_buffer,"test_init_no_read_buffer",0x56);
  UnityDefaultTestRun(test_init_no_buffer,"test_init_no_buffer",0x57);
  UnityDefaultTestRun(test_init_no_buffer_size_zero,"test_init_no_buffer_size_zero",0x58);
  iVar1 = UnityEnd();
  return iVar1;
}

Assistant:

int main(void)
{
	UNITY_BEGIN();
	RUN_TEST(test_init_read_buffer);
	RUN_TEST(test_init_no_read_buffer);
	RUN_TEST(test_init_no_buffer);
	RUN_TEST(test_init_no_buffer_size_zero);
	return UNITY_END();
}